

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_schema.c
# Opt level: O0

LY_ERR lys_print_mem(char **strp,lys_module *module,LYS_OUTFORMAT format,uint32_t options)

{
  ly_out *plStack_30;
  LY_ERR ret__;
  ly_out *out;
  uint32_t options_local;
  LYS_OUTFORMAT format_local;
  lys_module *module_local;
  char **strp_local;
  
  out._0_4_ = options;
  out._4_4_ = format;
  _options_local = module;
  module_local = (lys_module *)strp;
  if (strp == (char **)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","strp","lys_print_mem");
    strp_local._4_4_ = LY_EINVAL;
  }
  else if (module == (lys_module *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","module","lys_print_mem");
    strp_local._4_4_ = LY_EINVAL;
  }
  else {
    *strp = (char *)0x0;
    strp_local._4_4_ = ly_out_new_memory(strp,0,&stack0xffffffffffffffd0);
    if (strp_local._4_4_ == LY_SUCCESS) {
      strp_local._4_4_ = lys_print_(plStack_30,_options_local,out._4_4_,(uint32_t)out);
    }
  }
  return strp_local._4_4_;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lys_print_mem(char **strp, const struct lys_module *module, LYS_OUTFORMAT format, uint32_t options)
{
    struct ly_out *out;

    LY_CHECK_ARG_RET(NULL, strp, module, LY_EINVAL);

    /* init */
    *strp = NULL;

    LY_CHECK_RET(ly_out_new_memory(strp, 0, &out));
    return lys_print_(out, module, format, options);
}